

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O1

chunk * classic_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  short sVar1;
  ushort uVar2;
  room_profile *prVar3;
  loc to_avoid;
  uint uVar4;
  room_profile profile;
  _Bool _Var5;
  int16_t iVar6;
  uint32_t uVar7;
  int iVar8;
  wchar_t wVar9;
  uint32_t uVar10;
  quest *pqVar11;
  chunk *c;
  _Bool **pp_Var12;
  _Bool *p_Var13;
  void *p_00;
  void *pvVar14;
  cave_profile *pcVar15;
  dun_data *pdVar16;
  undefined1 (*pauVar17) [12];
  wchar_t by0;
  wchar_t wVar18;
  long lVar19;
  ulong uVar20;
  wchar_t wVar21;
  long lVar22;
  wchar_t wVar23;
  ulong uVar24;
  int iVar25;
  bool bVar26;
  int local_5c;
  
  wVar18 = dun->profile->dun_unusual;
  uVar7 = Rand_div(10);
  sVar1 = p->depth;
  pqVar11 = find_quest((int)p->place);
  pdVar16 = dun;
  iVar25 = 100;
  if (pqVar11 == (quest *)0x0) {
    iVar8 = (int)sVar1 / 0x18 + uVar7 + 1;
    iVar25 = 0x4b;
    if ((1 < iVar8) && (iVar25 = 0x50, iVar8 != 2)) {
      iVar25 = 0x55;
      if ((3 < iVar8) && (iVar25 = 0x5a, iVar8 != 4)) {
        iVar25 = (uint)(5 < iVar8) * 5 + 0x5f;
      }
    }
  }
  iVar25 = iVar25 * dun->profile->dun_rooms;
  uVar4 = iVar25 / 100;
  wVar9 = dun->profile->block_size;
  dun->block_hgt = wVar9;
  pdVar16->block_wid = wVar9;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = (int)p->place;
  if ((player->opts).opt[0x18] == true) {
    msg("height=%d  width=%d  nrooms=%d",(ulong)(uint)c->height,(ulong)(uint)c->width,(ulong)uVar4);
  }
  fill_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_GRANITE,L'\0'
                );
  pdVar16 = dun;
  wVar9 = c->height / dun->block_hgt;
  dun->row_blocks = wVar9;
  pdVar16->col_blocks = c->width / pdVar16->block_wid;
  pp_Var12 = (_Bool **)mem_zalloc((long)wVar9 << 3);
  pdVar16 = dun;
  dun->room_map = pp_Var12;
  wVar9 = pdVar16->row_blocks;
  if (L'\0' < wVar9) {
    lVar19 = 0;
    do {
      p_Var13 = (_Bool *)mem_zalloc((long)pdVar16->col_blocks);
      dun->room_map[lVar19] = p_Var13;
      lVar19 = lVar19 + 1;
      wVar9 = dun->row_blocks;
      pdVar16 = dun;
    } while (lVar19 < wVar9);
  }
  p_00 = mem_zalloc((long)wVar9 << 3);
  if (L'\0' < dun->row_blocks) {
    lVar19 = 0;
    do {
      pvVar14 = mem_zalloc((long)dun->col_blocks);
      *(void **)((long)p_00 + lVar19 * 8) = pvVar14;
      lVar19 = lVar19 + 1;
    } while (lVar19 < dun->row_blocks);
  }
  pdVar16 = dun;
  dun->pit_num = L'\0';
  pdVar16->cent_n = L'\0';
  reset_entrance_data(c);
  if (dun->persist == true) {
    build_staircase_rooms(c,"Classic Generation");
  }
  if (99 < iVar25) {
    local_5c = 0;
    do {
      if (dun->row_blocks < L'\x01') {
        bVar26 = true;
        by0 = L'\0';
        wVar9 = L'\0';
      }
      else {
        uVar24 = 0;
        uVar7 = 0;
        wVar9 = L'\0';
        uVar20 = 0;
        wVar21 = wVar9;
        do {
          if (L'\0' < dun->col_blocks) {
            lVar19 = 0;
            do {
              if (*(char *)(*(long *)((long)p_00 + uVar24 * 8) + lVar19) == '\0') {
                uVar7 = uVar7 + 1;
                uVar10 = Rand_div(uVar7);
                if (uVar10 == 0) {
                  uVar20 = uVar24 & 0xffffffff;
                }
                wVar9 = wVar21;
                if (uVar10 == 0) {
                  wVar9 = (wchar_t)lVar19;
                  wVar21 = (wchar_t)lVar19;
                }
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < dun->col_blocks);
          }
          by0 = (wchar_t)uVar20;
          uVar24 = uVar24 + 1;
        } while ((long)uVar24 < (long)dun->row_blocks);
        bVar26 = uVar7 == 0;
      }
      if (bVar26) break;
      if (*(char *)(*(long *)((long)p_00 + (long)by0 * 8) + (long)wVar9) == '\x01') {
        quit_fmt("generation: inconsistent blocks");
      }
      *(undefined1 *)(*(long *)((long)p_00 + (long)by0 * 8) + (long)wVar9) = 1;
      uVar7 = Rand_div(100);
      wVar21 = L'\0';
      wVar23 = L'\0';
      do {
        if (dun->profile->max_rarity <= wVar21) break;
        uVar10 = Rand_div(wVar18);
        wVar23 = wVar23 + (uint)((int)uVar10 < c->depth / 2 + 0x32);
        wVar21 = wVar21 + L'\x01';
      } while (wVar21 == wVar23);
      if (L'\0' < dun->profile->n_room_profiles) {
        lVar22 = 0;
        lVar19 = 0;
        do {
          prVar3 = dun->profile->room_profiles;
          _Var5 = false;
          if ((*(wchar_t *)((long)&prVar3->rarity + lVar22) <= wVar23) &&
             (_Var5 = false, (int)uVar7 < *(int *)((long)&prVar3->cutoff + lVar22))) {
            pauVar17 = (undefined1 (*) [12])((long)&prVar3->next + lVar22);
            profile.name._4_4_ = (int)((ulong)*(undefined8 *)(*pauVar17 + 8) >> 0x20);
            profile._0_12_ = *pauVar17;
            profile.builder = (room_builder)*(undefined8 *)(pauVar17[1] + 4);
            profile.rating = *(wchar_t *)((long)(pauVar17 + 2) + 0);
            profile.height = *(wchar_t *)((long)(pauVar17 + 2) + 4);
            profile._32_8_ = *(undefined8 *)(pauVar17[2] + 8);
            profile._40_8_ = *(undefined8 *)(pauVar17[3] + 4);
            profile._48_8_ = *(undefined8 *)pauVar17[4];
            _Var5 = room_build(c,by0,wVar9,profile,false);
            local_5c = local_5c + (uint)_Var5;
          }
          if (_Var5 != false) break;
          lVar19 = lVar19 + 1;
          lVar22 = lVar22 + 0x38;
        } while (lVar19 < dun->profile->n_room_profiles);
      }
    } while (local_5c < (int)uVar4);
  }
  if (L'\0' < dun->row_blocks) {
    lVar19 = 0;
    do {
      mem_free(*(void **)((long)p_00 + lVar19 * 8));
      mem_free(dun->room_map[lVar19]);
      lVar19 = lVar19 + 1;
    } while (lVar19 < dun->row_blocks);
  }
  mem_free(p_00);
  mem_free(dun->room_map);
  wVar18 = L'\0';
  draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',FEAT_PERM,L'\0',
                 true);
  do_traditional_tunneling(c);
  ensure_connectedness(c,true);
  pcVar15 = dun->profile;
  if (L'\0' < (pcVar15->str).mag) {
    do {
      build_streamer(c,FEAT_MAGMA,(pcVar15->str).mc);
      wVar18 = wVar18 + L'\x01';
      pcVar15 = dun->profile;
    } while (wVar18 < (pcVar15->str).mag);
  }
  pcVar15 = dun->profile;
  if (L'\0' < (pcVar15->str).qua) {
    wVar18 = L'\0';
    do {
      build_streamer(c,FEAT_QUARTZ,(pcVar15->str).qc);
      wVar18 = wVar18 + L'\x01';
      pcVar15 = dun->profile;
    } while (wVar18 < (pcVar15->str).qua);
  }
  _Var5 = dun->persist;
  wVar18 = rand_range(3,4);
  wVar9 = rand_range(1,2);
  handle_level_stairs(c,_Var5,wVar18,wVar9);
  wVar18 = c->depth;
  uVar7 = (uint)(L'\x05' < wVar18) * 8 + 2;
  if (0xffffffe4 < (uint)(wVar18 + L'\xffffffdf')) {
    uVar7 = wVar18 / 3;
  }
  uVar10 = Rand_div(uVar7);
  alloc_objects((chunk_conflict *)c,L'\x01',L'\0',uVar10 + L'\x01',c->depth,'\0');
  uVar10 = Rand_div(uVar7);
  alloc_objects((chunk_conflict *)c,L'\x01',L'\x01',(int)(uVar10 + 1) / 5,c->depth,'\0');
  _Var5 = new_player_spot((chunk_conflict *)c,p);
  if (_Var5) {
    uVar2 = z_info->level_monster_min;
    uVar10 = Rand_div(8);
    if (0 < (int)((uint)uVar2 + uVar7 + uVar10 + 1)) {
      iVar25 = uVar7 + uVar10 + (uint)uVar2 + 2;
      do {
        to_avoid.x = (p->grid).x;
        to_avoid.y = (p->grid).y;
        pick_and_place_distant_monster(c,to_avoid,L'\0',true,c->depth);
        iVar25 = iVar25 + -1;
      } while (1 < iVar25);
    }
    iVar6 = Rand_normal((uint)z_info->room_item_av,3);
    alloc_objects((chunk_conflict *)c,L'\x02',L'\x03',(int)iVar6,c->depth,'\x01');
    iVar6 = Rand_normal((uint)z_info->both_item_av,3);
    alloc_objects((chunk_conflict *)c,L'\x03',L'\x03',(int)iVar6,c->depth,'\x01');
    iVar6 = Rand_normal((uint)z_info->both_gold_av,3);
    alloc_objects((chunk_conflict *)c,L'\x03',L'\x02',(int)iVar6,c->depth,'\x01');
  }
  else {
    uncreate_artifacts((chunk_conflict *)c);
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "could not place player";
    c = (chunk *)0x0;
  }
  return c;
}

Assistant:

struct chunk *classic_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, j, k;
	int by, bx = 0, tby, tbx, key, rarity, built;
	int num_rooms, size_percent;
	int dun_unusual = dun->profile->dun_unusual;

	bool **blocks_tried;
	struct chunk *c;

	/* This code currently does nothing - see comments below */
	i = randint1(10) + p->depth / 24;
	if (find_quest(p->place)) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;

	/* scale the various generation variables */
	num_rooms = (dun->profile->dun_rooms * size_percent) / 100;
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;
	c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = p->place;
	ROOM_LOG("height=%d  width=%d  nrooms=%d", c->height, c->width, num_rooms);

	/* Fill cave area with basic granite */
	fill_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_GRANITE, SQUARE_NONE);

	/* Actual maximum number of rooms on this level */
	dun->row_blocks = c->height / dun->block_hgt;
	dun->col_blocks = c->width / dun->block_wid;

	/* Initialize the room table */
	dun->room_map = mem_zalloc(dun->row_blocks * sizeof(bool*));
	for (i = 0; i < dun->row_blocks; i++)
		dun->room_map[i] = mem_zalloc(dun->col_blocks * sizeof(bool));

	/* Initialize the block table */
	blocks_tried = mem_zalloc(dun->row_blocks * sizeof(bool*));

	for (i = 0; i < dun->row_blocks; i++)
		blocks_tried[i] = mem_zalloc(dun->col_blocks * sizeof(bool));

	/* No rooms yet, pits or otherwise. */
	dun->pit_num = 0;
	dun->cent_n = 0;
	reset_entrance_data(c);

	/* Build the special staircase rooms */
	if (dun->persist) {
		build_staircase_rooms(c, "Classic Generation");
	}

	/* Build some rooms.  Note that the theoretical maximum number of rooms
	 * in this profile is currently 36, so built never reaches num_rooms,
	 * and room generation is always terminated by having tried all blocks */
	built = 0;
	while(built < num_rooms) {

		/* Count the room blocks we haven't tried yet. */
		j = 0;
		tby = 0;
		tbx = 0;
		for(by = 0; by < dun->row_blocks; by++) {
			for(bx = 0; bx < dun->col_blocks; bx++) {
				if (blocks_tried[by][bx]) continue;
				j++;
				if (one_in_(j)) {
					tby = by;
					tbx = bx;
				}
			} 
		}
		bx = tbx;
		by = tby;

		/* If we've tried all blocks we're done. */
		if (j == 0) break;

		if (blocks_tried[by][bx]) quit_fmt("generation: inconsistent blocks");

		/* Mark that we are trying this block. */
		blocks_tried[by][bx] = true;

		/* Roll for random key (to be compared against a profile's cutoff) */
		key = randint0(100);

		/* We generate a rarity number to figure out how exotic to make
		 * the room. This number has a (50+depth/2)/DUN_UNUSUAL chance
		 * of being > 0, a (50+depth/2)^2/DUN_UNUSUAL^2 chance of
		 * being > 1, up to MAX_RARITY. */
		i = 0;
		rarity = 0;
		while (i == rarity && i < dun->profile->max_rarity) {
			if (randint0(dun_unusual) < 50 + c->depth / 2) rarity++;
			i++;
		}

		/* Once we have a key and a rarity, we iterate through out list of
		 * room profiles looking for a match (whose cutoff > key and whose
		 * rarity > this rarity). We try building the room, and if it works
		 * then we are done with this iteration. We keep going until we find
		 * a room that we can build successfully or we exhaust the profiles. */
		for (i = 0; i < dun->profile->n_room_profiles; i++) {
			struct room_profile profile = dun->profile->room_profiles[i];
			if (profile.rarity > rarity) continue;
			if (profile.cutoff <= key) continue;
			
			if (room_build(c, by, bx, profile, false)) {
				built++;
				break;
			}
		}
	}

	for (i = 0; i < dun->row_blocks; i++){
		mem_free(blocks_tried[i]);
		mem_free(dun->room_map[i]);
	}
	mem_free(blocks_tried);
	mem_free(dun->room_map);

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1, 
		FEAT_PERM, SQUARE_NONE, true);

	/* Connect all the rooms together */
	do_traditional_tunneling(c);
	ensure_connectedness(c, true);

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(c, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(c, FEAT_QUARTZ, dun->profile->str.qc);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, rand_range(3, 4), rand_range(1, 2));

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}